

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_long>::Add
          (RepeatedFieldWrapper<unsigned_long> *this,Field *data,Value *value)

{
  int iVar1;
  undefined4 extraout_var;
  unsigned_long local_10;
  
  iVar1 = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
            _vptr_RepeatedFieldAccessor[0x10])(this,value);
  local_10 = CONCAT44(extraout_var,iVar1);
  RepeatedField<unsigned_long>::Add((RepeatedField<unsigned_long> *)data,&local_10);
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }